

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O3

void __thiscall gui::ChatBox::draw(ChatBox *this,RenderTarget *target,RenderStates states)

{
  long lVar1;
  Text *this_00;
  element_type *peVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  Transform *right;
  pointer ppVar6;
  ulong uVar7;
  size_t sVar8;
  pointer ppVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  Vector2f local_70;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  bVar4 = Widget::isVisible(&this->super_Widget);
  if (bVar4) {
    right = Widget::getTransform(&this->super_Widget);
    sf::operator*=(&states.transform,right);
    updateVisibleLines(this,true);
    if (this->autoHide_ == false) {
      sf::RectangleShape::setSize
                (&((this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->rect_,&this->size_);
      sf::RenderTarget::draw
                (target,(Drawable *)
                        &((this->style_).
                          super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->rect_,&states);
    }
    peVar2 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    fVar13 = (peVar2->textPadding_).z;
    uVar5 = sf::Text::getCharacterSize(&peVar2->text_);
    if (((this->visibleLines_).
         super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         (this->visibleLines_).
         super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
         ._M_impl.super__Vector_impl_data._M_start) &&
       ((this->autoHide_ != true || (this->hideCounter_ != 0)))) {
      fVar13 = fVar13 * (float)uVar5;
      peVar2 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      fVar14 = (float)((this->sizeCharacters_).y - 1) * fVar13 + (peVar2->textPadding_).y;
      local_68 = (peVar2->textPadding_).x;
      uStack_60 = 0;
      uStack_5c = 0;
      uVar10 = 0;
      sVar8 = 0;
      lVar11 = 0;
      do {
        peVar2 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        fStack_64 = fVar14;
        local_58 = roundf(local_68);
        local_48 = fStack_64;
        fStack_44 = fStack_64;
        fStack_40 = fStack_64;
        fStack_3c = fStack_64;
        fVar14 = roundf(fStack_64);
        local_70.y = fVar14;
        local_70.x = local_58;
        sf::Transformable::setPosition(&(peVar2->text_).super_Transformable,&local_70);
        sf::Text::setString(&((this->style_).
                              super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->text_,
                            (String *)
                            ((long)&(((this->visibleLines_).
                                      super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second).
                                    super_Shape.super_Transformable + lVar11 + 0xffffffffffffffc8U))
        ;
        peVar2 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        this_00 = &peVar2->text_;
        if (this->autoHide_ == false) {
          sf::Text::setFillColor
                    (this_00,(Color *)((long)&(((this->visibleLines_).
                                                super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->second).
                                              super_Shape.super_Transformable +
                                      lVar11 + 0xffffffffffffffe8U));
        }
        else {
          sf::Text::setFillColor(this_00,&peVar2->invertedTextColor_);
          ppVar9 = (this->visibleLines_).
                   super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          sf::Shape::setFillColor
                    ((Shape *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                              lVar11 + 0xfffffffffffffff8U),
                     (Color *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                              lVar11 + 0xffffffffffffffe8U));
          sf::RenderTarget::draw
                    (target,(Drawable *)
                            ((long)&(((this->visibleLines_).
                                      super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second).
                                    super_Shape.super_Transformable + lVar11 + 0xfffffffffffffff8U),
                     &states);
        }
        sf::Text::setStyle(&((this->style_).
                             super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->text_,
                           *(Uint32 *)
                            ((long)&(((this->visibleLines_).
                                      super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second).
                                    super_Shape.super_Transformable + lVar11 + 0xffffffffffffffecU))
        ;
        sf::RenderTarget::draw
                  (target,&(((this->style_).
                             super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->text_).super_Drawable,&states);
        uVar10 = uVar10 + 1;
        ppVar9 = (this->visibleLines_).
                 super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->visibleLines_).
                           super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 3) *
                   0x7d6343eb1a1f58d1) <= uVar10) break;
        lVar1 = lVar11 + 0x188;
        fVar14 = local_48 - fVar13;
        sVar8 = sVar8 + (*(long *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                                  lVar11 + 0xfffffffffffffff0U) !=
                        *(long *)((long)&ppVar9[1].second.super_Shape.super_Transformable +
                                 lVar11 + 0xfffffffffffffff0U));
        lVar11 = lVar1;
      } while ((this->autoHide_ != true) || (sVar8 != this->hideCounter_));
    }
    if ((this->autoHide_ == false) && (bVar4 = Widget::isFocused(&this->super_Widget), bVar4)) {
      uVar7 = 0xffffffffffffffff;
      uVar10 = 0xffffffffffffffff;
      if ((this->selectionStart_).second == true) {
        uVar12 = (this->selectionStart_).first;
        uVar10 = this->selectionEnd_;
        uVar7 = uVar12;
        if (uVar10 < uVar12) {
          uVar7 = uVar10;
          uVar10 = uVar12;
        }
      }
      ppVar9 = (this->visibleLines_).
               super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 = (this->visibleLines_).
               super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar6 != ppVar9) {
        lVar11 = 0x30;
        uVar12 = 0;
        do {
          uVar3 = *(ulong *)((long)(ppVar9->second).super_Shape.super_Transformable.m_transform.
                                   m_matrix + lVar11 + -100);
          if ((uVar7 <= uVar3) && (uVar3 <= uVar10)) {
            sf::Shape::setFillColor
                      ((Shape *)((long)(ppVar9->second).super_Shape.super_Transformable.m_transform.
                                       m_matrix + lVar11 + -0x5c),
                       &((this->style_).
                         super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        highlightColor_);
            sf::RenderTarget::draw
                      (target,(Drawable *)
                              ((long)&(((this->visibleLines_).
                                        super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second).
                                      super_Shape.super_Transformable + lVar11 + 0xffffffffffffffc8U
                              ),&states);
            ppVar9 = (this->visibleLines_).
                     super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar6 = (this->visibleLines_).
                     super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 0x188;
        } while (uVar12 < (ulong)(((long)ppVar6 - (long)ppVar9 >> 3) * 0x7d6343eb1a1f58d1));
      }
    }
  }
  return;
}

Assistant:

void ChatBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    updateVisibleLines(true);

    if (!autoHide_) {
        style_->rect_.setSize(size_);
        target.draw(style_->rect_, states);
    }

    const float textHeight = style_->textPadding_.z * style_->getCharacterSize();
    sf::Vector2f lastPosition = {
        style_->textPadding_.x,
        style_->textPadding_.y + textHeight * (sizeCharacters_.y - 1)
    };
    size_t lineCount = 0;
    for (size_t i = 0; i < visibleLines_.size(); ++i) {
        if (autoHide_ && lineCount == hideCounter_) {
            break;
        }
        style_->text_.setPosition(roundVector2f(lastPosition));
        style_->text_.setString(visibleLines_[i].first.str);
        if (!autoHide_) {
            style_->text_.setFillColor(visibleLines_[i].first.color);
        } else {
            style_->text_.setFillColor(style_->invertedTextColor_);
            visibleLines_[i].second.setFillColor(visibleLines_[i].first.color);
            target.draw(visibleLines_[i].second, states);
        }
        style_->text_.setStyle(visibleLines_[i].first.style);
        target.draw(style_->text_, states);
        lastPosition.y -= textHeight;
        if (i + 1 < visibleLines_.size() && visibleLines_[i].first.id != visibleLines_[i + 1].first.id) {
            ++lineCount;
        }
    }

    if (!autoHide_ && isFocused()) {
        size_t selectionMin = std::numeric_limits<size_t>::max();
        size_t selectionMax = std::numeric_limits<size_t>::max();
        if (selectionStart_.second) {
            selectionMin = std::min(selectionStart_.first, selectionEnd_);
            selectionMax = std::max(selectionStart_.first, selectionEnd_);
        }

        for (size_t i = 0; i < visibleLines_.size(); ++i) {
            if (visibleLines_[i].first.id >= selectionMin && visibleLines_[i].first.id <= selectionMax) {
                visibleLines_[i].second.setFillColor(style_->highlightColor_);
                target.draw(visibleLines_[i].second, states);
            }
        }
    }
}